

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O2

void __thiscall
duckdb::TableStatistics::CopyStats
          (TableStatistics *this,TableStatisticsLock *lock,TableStatistics *other)

{
  pointer psVar1;
  long *plVar2;
  element_type *peVar3;
  pointer this_00;
  ReservoirSample *pRVar4;
  pointer this_01;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  make_shared_ptr<std::mutex>();
  shared_ptr<std::mutex,_true>::operator=
            (&other->stats_lock,(shared_ptr<std::mutex,_true> *)&stack0xffffffffffffffb8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  psVar1 = (this->column_stats).
           super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  for (this_01 = (this->column_stats).
                 super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    shared_ptr<duckdb::ColumnStatistics,_true>::operator->(this_01);
    ColumnStatistics::Copy((ColumnStatistics *)&stack0xffffffffffffffb8);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
              ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
                *)&other->column_stats,
               (shared_ptr<duckdb::ColumnStatistics,_true> *)&stack0xffffffffffffffb8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  }
  if ((this->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl != (BlockingSample *)0x0)
  {
    this_00 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
              ::operator->(&this->table_sample);
    pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(this_00);
    (*(pRVar4->super_BlockingSample)._vptr_BlockingSample[3])(&stack0xffffffffffffffb8,pRVar4);
    peVar3 = local_48;
    local_48 = (element_type *)0x0;
    plVar2 = *(long **)&local_38._M_pi[2]._M_use_count;
    *(element_type **)&local_38._M_pi[2]._M_use_count = peVar3;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
      if (local_48 != (element_type *)0x0) {
        (**(code **)(((__native_type *)&(local_48->stats).type)->__align + 8))();
      }
    }
  }
  return;
}

Assistant:

void TableStatistics::CopyStats(TableStatisticsLock &lock, TableStatistics &other) {
	D_ASSERT(other.Empty());
	other.stats_lock = make_shared_ptr<mutex>();
	for (auto &stats : column_stats) {
		other.column_stats.push_back(stats->Copy());
	}

	if (table_sample) {
		D_ASSERT(table_sample->type == SampleType::RESERVOIR_SAMPLE);
		auto &res = table_sample->Cast<ReservoirSample>();
		other.table_sample = res.Copy();
	}
}